

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O0

void amrex::EB2::IndexSpace::push(IndexSpace *ispace)

{
  bool bVar1;
  __normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
  __last;
  __normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
  __first;
  iterator __middle;
  __normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
  r;
  vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>
  *in_stack_ffffffffffffffb0;
  anon_class_8_1_5ad9bb7b_for__M_pred in_stack_ffffffffffffffb8;
  __normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
  in_stack_ffffffffffffffc8;
  
  std::
  vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>
  ::begin(in_stack_ffffffffffffff98);
  std::
  vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>
  ::end(in_stack_ffffffffffffff98);
  __last = std::
           find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>*,std::vector<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>,std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>>>>,amrex::EB2::IndexSpace::push(amrex::EB2::IndexSpace*)::__0>
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
  ;
  std::
  vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>
  ::end(in_stack_ffffffffffffff98);
  bVar1 = __gnu_cxx::operator==
                    (in_stack_ffffffffffffffa0,
                     (__normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
                      *)in_stack_ffffffffffffff98);
  if (bVar1) {
    std::
    vector<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>,std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>>>
    ::emplace_back<amrex::EB2::IndexSpace*&>
              (in_stack_ffffffffffffffb0,(IndexSpace **)in_stack_ffffffffffffffa8);
  }
  else {
    __first = __gnu_cxx::
              __normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
              ::operator+(in_stack_ffffffffffffffa8,(difference_type)in_stack_ffffffffffffffa0);
    __middle = std::
               vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>
               ::end(in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
      ::operator+(in_stack_ffffffffffffffa8,(difference_type)in_stack_ffffffffffffffa0);
      std::
      vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>
      ::end(in_stack_ffffffffffffff98);
      std::_V2::
      rotate<__gnu_cxx::__normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>*,std::vector<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>,std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>>>>>
                (__first,(__normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_*,_std::vector<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>,_std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>_>_>_>
                          )__middle._M_current,__last);
    }
  }
  return;
}

Assistant:

void
IndexSpace::push (IndexSpace* ispace)
{
    auto r = std::find_if(m_instance.begin(), m_instance.end(),
                          [=] (const std::unique_ptr<IndexSpace>& x) -> bool
                          { return x.get() == ispace; });
    if (r == m_instance.end()) {
        m_instance.emplace_back(ispace);
    } else if (r+1 != m_instance.end()) {
        std::rotate(r, r+1, m_instance.end());
    }
}